

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

mir_size_t get_object_path_offset(c2m_ctx_t c2m_ctx)

{
  ulong uVar1;
  int iVar2;
  init_object_t *piVar3;
  long lVar4;
  int *piVar5;
  type *type;
  mir_size_t mVar6;
  VARR_init_object_t *pVVar7;
  decl_t decl;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  mir_size_t unaff_R14;
  
  pVVar7 = c2m_ctx->init_object_path;
  if (pVVar7 != (VARR_init_object_t *)0x0) {
    uVar9 = 0xffffffffffffffff;
    lVar10 = 0x10;
    unaff_R14 = 0;
    do {
      uVar9 = uVar9 + 1;
      if (pVVar7->els_num <= uVar9) {
        return unaff_R14;
      }
      piVar3 = pVVar7->varr;
      if (piVar3 == (init_object_t *)0x0) {
        get_object_path_offset_cold_1();
LAB_001ab7a3:
        __assert_fail("init_object.u.curr_member->code == N_MEMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2cab,"mir_size_t get_object_path_offset(c2m_ctx_t)");
      }
      lVar4 = *(long *)((long)piVar3 + lVar10 + -0x10);
      piVar5 = *(int **)((long)&piVar3->container_type + lVar10);
      iVar2 = *(int *)(lVar4 + 0x18);
      if (iVar2 - 4U < 2) {
        if (*piVar5 != 0x6c) goto LAB_001ab7a3;
        lVar4 = *(long *)(piVar5 + 2);
        if ((lVar4 == 0) || (*(char *)(*(long *)(lVar4 + 0x40) + 0x1d) == '\0')) {
          unaff_R14 = unaff_R14 + *(long *)(lVar4 + 0x10);
        }
      }
      else {
        if (iVar2 != 6) {
          __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2caa,"mir_size_t get_object_path_offset(c2m_ctx_t)");
        }
        type = *(type **)(*(long *)(lVar4 + 0x30) + 8);
        mVar6 = raw_type_size(c2m_ctx,type);
        uVar8 = (ulong)type->align;
        if (uVar8 != 0) {
          uVar1 = (mVar6 - 1) + uVar8;
          mVar6 = uVar1 - uVar1 % uVar8;
        }
        pVVar7 = c2m_ctx->init_object_path;
        unaff_R14 = unaff_R14 + mVar6 * (long)piVar5;
      }
      lVar10 = lVar10 + 0x18;
    } while (pVVar7 != (VARR_init_object_t *)0x0);
  }
  get_object_path_offset_cold_2();
  return unaff_R14;
}

Assistant:

static mir_size_t get_object_path_offset (c2m_ctx_t c2m_ctx) {
  init_object_t init_object;
  size_t offset = 0;

  for (size_t i = 0; i < VARR_LENGTH (init_object_t, init_object_path); i++) {
    init_object = VARR_GET (init_object_t, init_object_path, i);
    if (init_object.container_type->mode == TM_ARR) {  // ??? index < 0
      offset += (init_object.u.curr_index
                 * type_size (c2m_ctx, init_object.container_type->u.arr_type->el_type));
    } else {
      assert (init_object.container_type->mode == TM_STRUCT
              || init_object.container_type->mode == TM_UNION);
      assert (init_object.u.curr_member->code == N_MEMBER);
      if (!anon_struct_union_type_member_p (init_object.u.curr_member))
        /* Members inside anon struct/union already have adjusted offset */
        offset += ((decl_t) init_object.u.curr_member->attr)->offset;
    }
  }
  return offset;
}